

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsay.c
# Opt level: O1

void speak_file(OpenJTalk *openjtalk,FILE *fp)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  char line [1001];
  char local_408 [1008];
  
  if (fp == (FILE *)0x0) {
    exit(1);
  }
  iVar2 = getc((FILE *)fp);
  if ((((char)iVar2 != -0x11) || (iVar2 = getc((FILE *)fp), (char)iVar2 != -0x45)) ||
     (iVar2 = getc((FILE *)fp), (char)iVar2 != -0x41)) {
    fseek((FILE *)fp,0,0);
  }
  pcVar3 = fgets(local_408,0x104,(FILE *)fp);
  do {
    pcVar4 = local_408;
    if (pcVar3 == (char *)0x0) {
      fclose((FILE *)fp);
      return;
    }
    for (; cVar1 = *pcVar4, cVar1 != '\0'; pcVar4 = pcVar4 + 1) {
      if ((cVar1 == '\n') || (cVar1 == '\r')) {
        *pcVar4 = '\0';
        break;
      }
    }
    if (local_408[0] != '\0') {
      openjtalk_speakSync(openjtalk,local_408);
    }
    pcVar3 = fgets(local_408,0x104,(FILE *)fp);
  } while( true );
}

Assistant:

void speak_file(OpenJTalk *openjtalk, FILE* fp)
{
	char line[MAX_LENGTH + 1];

	if (fp == NULL)
	{
		exit(EXIT_FAILURE);
	}

	if ((getc(fp) & 0xFF) != 0xEF || (getc(fp) & 0xFF) != 0xBB || (getc(fp) & 0xFF) != 0xBF)
	{
		fseek(fp, 0, SEEK_SET);
	}

	while (fgets(line, MAX_PATH, fp) != NULL)
	{
		remove_cr_lf(line);
		if (strlen(line) == 0)
		{
			continue;
		}

		openjtalk_speakSync(openjtalk, line);
	}
	fclose(fp);
}